

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_append_vector(flatcc_builder_t *B,void *data,size_t count)

{
  int iVar1;
  size_t count_local;
  void *data_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type == 4) {
    iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,(B->frame->container).vector.max_count);
    if (iVar1 == 0) {
      B_local = (flatcc_builder_t *)
                push_ds_copy(B,data,(B->frame->container).table.vs_end *
                                    (flatbuffers_uoffset_t)count);
    }
    else {
      B_local = (flatcc_builder_t *)0x0;
    }
    return B_local;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x3a8,
                "void *flatcc_builder_append_vector(flatcc_builder_t *, const void *, size_t)");
}

Assistant:

void *flatcc_builder_append_vector(flatcc_builder_t *B, const void *data, size_t count)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds_copy(B, data, frame(container.vector.elem_size) * (uoffset_t)count);
}